

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool cmakeCheckStampFile(char *stampName)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  char *f2;
  ostream *poVar7;
  allocator local_651;
  string local_650;
  undefined1 local_630 [8];
  ofstream stamp;
  char *stampTemp;
  string stampTempString;
  ostringstream stampTempStream;
  int local_28c;
  undefined1 local_288 [4];
  int result;
  string dep;
  cmFileTimeComparison ftc;
  long local_258;
  ifstream fin;
  allocator local_39;
  string local_38 [8];
  string stampDepends;
  char *stampName_local;
  
  stampDepends.field_2._8_8_ = stampName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,stampName,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=(local_38,".depend");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_258,pcVar5,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_258 + *(long *)(local_258 + -0x18)));
  if ((bVar2 & 1) == 0) {
    cmFileTimeComparison::cmFileTimeComparison((cmFileTimeComparison *)((long)&dep.field_2 + 8));
    std::__cxx11::string::string((string *)local_288);
    do {
      do {
        bVar3 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&local_258,(string *)local_288,(bool *)0x0,-1);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)(stampTempString.field_2._M_local_buf + 8));
          poVar7 = std::operator<<((ostream *)((long)&stampTempString.field_2 + 8),
                                   (char *)stampDepends.field_2._8_8_);
          poVar7 = std::operator<<(poVar7,".tmp");
          uVar4 = cmSystemTools::RandomSeed();
          std::ostream::operator<<(poVar7,uVar4);
          std::__cxx11::ostringstream::str();
          stamp._504_8_ = std::__cxx11::string::c_str();
          std::ofstream::ofstream(local_630,(char *)stamp._504_8_,_S_out);
          std::operator<<((ostream *)local_630,
                          "# CMake generation timestamp file for this directory.\n");
          std::ofstream::~ofstream(local_630);
          stampName_local._7_1_ =
               cmSystemTools::RenameFile((char *)stamp._504_8_,(char *)stampDepends.field_2._8_8_);
          uVar1 = stamp._504_8_;
          if (stampName_local._7_1_) {
            poVar7 = std::operator<<((ostream *)&std::cout,"CMake does not need to re-run because ")
            ;
            poVar7 = std::operator<<(poVar7,(char *)stampDepends.field_2._8_8_);
            std::operator<<(poVar7," is up-to-date.\n");
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_650,(char *)uVar1,&local_651);
            cmsys::SystemTools::RemoveFile(&local_650);
            std::__cxx11::string::~string((string *)&local_650);
            std::allocator<char>::~allocator((allocator<char> *)&local_651);
            cmSystemTools::Error
                      ("Cannot restore timestamp ",(char *)stampDepends.field_2._8_8_,(char *)0x0,
                       (char *)0x0);
          }
          std::__cxx11::string::~string((string *)&stampTemp);
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)(stampTempString.field_2._M_local_buf + 8));
          goto LAB_00520602;
        }
        uVar6 = std::__cxx11::string::empty();
      } while (((uVar6 & 1) != 0) ||
              (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_288), *pcVar5 == '#'))
      ;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      f2 = (char *)std::__cxx11::string::c_str();
      bVar3 = cmFileTimeComparison::FileTimeCompare
                        ((cmFileTimeComparison *)((long)&dep.field_2 + 8),pcVar5,f2,&local_28c);
    } while ((bVar3) && (-1 < local_28c));
    poVar7 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar7 = std::operator<<(poVar7,(char *)stampDepends.field_2._8_8_);
    std::operator<<(poVar7," is out-of-date.\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"  the file \'");
    poVar7 = std::operator<<(poVar7,(string *)local_288);
    std::operator<<(poVar7,"\'\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"  is newer than \'");
    poVar7 = std::operator<<(poVar7,local_38);
    std::operator<<(poVar7,"\'\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"  result=\'");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_28c);
    std::operator<<(poVar7,"\'\n");
    stampName_local._7_1_ = false;
LAB_00520602:
    std::__cxx11::string::~string((string *)local_288);
    cmFileTimeComparison::~cmFileTimeComparison((cmFileTimeComparison *)((long)&dep.field_2 + 8));
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar7 = std::operator<<(poVar7,(char *)stampDepends.field_2._8_8_);
    std::operator<<(poVar7," dependency file is missing.\n");
    stampName_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_258);
  std::__cxx11::string::~string(local_38);
  return stampName_local._7_1_;
}

Assistant:

static bool cmakeCheckStampFile(const char* stampName)
{
  // The stamp file does not exist.  Use the stamp dependencies to
  // determine whether it is really out of date.  This works in
  // conjunction with cmLocalVisualStudio7Generator to avoid
  // repeatedly re-running CMake when the user rebuilds the entire
  // solution.
  std::string stampDepends = stampName;
  stampDepends += ".depend";
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in);
#endif
  if(!fin)
    {
    // The stamp dependencies file cannot be read.  Just assume the
    // build system is really out of date.
    std::cout << "CMake is re-running because " << stampName
              << " dependency file is missing.\n";
    return false;
    }

  // Compare the stamp dependencies against the dependency file itself.
  cmFileTimeComparison ftc;
  std::string dep;
  while(cmSystemTools::GetLineFromStream(fin, dep))
    {
    int result;
    if(!dep.empty() && dep[0] != '#' &&
       (!ftc.FileTimeCompare(stampDepends.c_str(), dep.c_str(), &result)
        || result < 0))
      {
      // The stamp depends file is older than this dependency.  The
      // build system is really out of date.
      std::cout << "CMake is re-running because " << stampName
                << " is out-of-date.\n";
      std::cout << "  the file '" << dep << "'\n";
      std::cout << "  is newer than '" << stampDepends << "'\n";
      std::cout << "  result='" << result << "'\n";
      return false;
      }
    }

  // The build system is up to date.  The stamp file has been removed
  // by the VS IDE due to a "rebuild" request.  Restore it atomically.
  std::ostringstream stampTempStream;
  stampTempStream << stampName << ".tmp" << cmSystemTools::RandomSeed();
  std::string stampTempString = stampTempStream.str();
  const char* stampTemp = stampTempString.c_str();
  {
  // TODO: Teach cmGeneratedFileStream to use a random temp file (with
  // multiple tries in unlikely case of conflict) and use that here.
  cmsys::ofstream stamp(stampTemp);
  stamp << "# CMake generation timestamp file for this directory.\n";
  }
  if(cmSystemTools::RenameFile(stampTemp, stampName))
    {
    // Notify the user why CMake is not re-running.  It is safe to
    // just print to stdout here because this code is only reachable
    // through an undocumented flag used by the VS generator.
    std::cout << "CMake does not need to re-run because "
              << stampName << " is up-to-date.\n";
    return true;
    }
  else
    {
    cmSystemTools::RemoveFile(stampTemp);
    cmSystemTools::Error("Cannot restore timestamp ", stampName);
    return false;
    }
}